

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O3

void __thiscall
QEvdevTabletHandler::QEvdevTabletHandler
          (QEvdevTabletHandler *this,QString *device,QString *spec,QObject *parent)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  QEvdevTabletData *pQVar6;
  QSocketNotifier *this_00;
  undefined4 *puVar7;
  char *__file;
  long in_FS_OFFSET;
  QAnyStringView QVar8;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [8];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_0010d5f8;
  this->m_fd = -1;
  pDVar1 = (device->d).d;
  (this->m_device).d.d = pDVar1;
  (this->m_device).d.ptr = (device->d).ptr;
  (this->m_device).d.size = (device->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->m_notifier = (QSocketNotifier *)0x0;
  this->d = (QEvdevTabletData *)0x0;
  QVar8.m_size = (size_t)"Evdev Tablet Handler";
  QVar8.field_0.m_data = this;
  QObject::setObjectName(QVar8);
  QtPrivateLogging::qLcEvdevTablet();
  if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 0;
    local_40 = QtPrivateLogging::qLcEvdevTablet::category.name;
    uVar4 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"evdevtablet: using %ls",uVar4);
  }
  QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)(device->d).ptr);
  __file = (char *)CONCAT44(uStack_4c,uStack_50);
  if (__file == (char *)0x0) {
    __file = (char *)&QByteArray::_empty;
  }
  do {
    iVar3 = open64(__file,0x80800,0);
    if (iVar3 != -1) break;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  this->m_fd = iVar3;
  piVar5 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),1,0x10);
    }
    iVar3 = this->m_fd;
  }
  if (iVar3 < 0) {
    uVar4 = QString::utf16();
    qErrnoWarning("evdevtablet: Cannot open input device %ls",uVar4);
  }
  else {
    iVar3 = ioctl(iVar3,0x40044590,1);
    if (iVar3 == 0) {
      ioctl(this->m_fd,0x40044590,0);
    }
    else {
      QEvdevTabletHandler((QEvdevTabletHandler *)device);
    }
    pQVar6 = (QEvdevTabletData *)operator_new(0x78);
    pQVar6->q = this;
    pQVar6->lastEventType = 0;
    (pQVar6->devName).d.d = (Data *)0x0;
    (pQVar6->devName).d.ptr = (char16_t *)0x0;
    (pQVar6->devName).d.size = 0;
    (pQVar6->minValues).x = 0;
    (pQVar6->minValues).y = 0;
    (pQVar6->minValues).p = 0;
    (pQVar6->minValues).d = 0;
    (pQVar6->maxValues).x = 0;
    (pQVar6->maxValues).y = 0;
    (pQVar6->maxValues).p = 0;
    (pQVar6->maxValues).d = 0;
    (pQVar6->state).x = 0;
    (pQVar6->state).y = 0;
    (pQVar6->state).p = 0;
    (pQVar6->state).d = 0;
    (pQVar6->state).down = false;
    (pQVar6->state).lastReportDown = false;
    *(undefined2 *)&(pQVar6->state).field_0x12 = 0;
    (pQVar6->state).tool = 0;
    *(undefined8 *)&(pQVar6->state).lastReportTool = 0;
    (pQVar6->state).lastReportPos.xp = 0.0;
    (pQVar6->state).lastReportPos.yp = 0.0;
    this->d = pQVar6;
    bVar2 = queryLimits(this);
    if (!bVar2) {
      QEvdevTabletHandler((QEvdevTabletHandler *)device);
    }
    this_00 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_00,(long)this->m_fd,Read,&this->super_QObject);
    this->m_notifier = this_00;
    local_70 = readData;
    local_68 = (ImplFn)0x0;
    local_58 = 0x10f100;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QCallableObject<void_(QEvdevTabletHandler::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = readData;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)this_00,(QObject *)&local_58,(void **)this,
               (QSlotObjectBase *)&local_70,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevTabletHandler::QEvdevTabletHandler(const QString &device, const QString &spec, QObject *parent)
    : QObject(parent), m_fd(-1), m_device(device), m_notifier(0), d(0)
{
    Q_UNUSED(spec);

    setObjectName("Evdev Tablet Handler"_L1);

    qCDebug(qLcEvdevTablet, "evdevtablet: using %ls", qUtf16Printable(device));

    m_fd = QT_OPEN(device.toLocal8Bit().constData(), O_RDONLY | O_NDELAY, 0);
    if (m_fd < 0) {
        qErrnoWarning("evdevtablet: Cannot open input device %ls", qUtf16Printable(device));
        return;
    }

    bool grabSuccess = !ioctl(m_fd, EVIOCGRAB, (void *) 1);
    if (grabSuccess)
        ioctl(m_fd, EVIOCGRAB, (void *) 0);
    else
        qWarning("evdevtablet: %ls: The device is grabbed by another process. No events will be read.", qUtf16Printable(device));

    d = new QEvdevTabletData(this);
    if (!queryLimits())
        qWarning("evdevtablet: %ls: Unset or invalid ABS limits. Behavior will be unspecified.", qUtf16Printable(device));

    m_notifier = new QSocketNotifier(m_fd, QSocketNotifier::Read, this);
    connect(m_notifier, &QSocketNotifier::activated, this, &QEvdevTabletHandler::readData);
}